

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

int __thiscall
QTextDocumentPrivate::insertBlock
          (QTextDocumentPrivate *this,QChar blockSeparator,int pos,int blockFormat,int charFormat,
          Operation op)

{
  BlockMap *this_00;
  Header *pHVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long in_FS_OFFSET;
  bool bVar9;
  bool bVar10;
  uint local_8c;
  QTextUndoCommand local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  beginEditBlock(this);
  uVar5 = (uint)(this->text).d.size;
  QString::append((QChar)((short)this + L'\x80'));
  this_00 = &this->blocks;
  uVar2 = QFragmentMapData<QTextBlockData>::findNode(&this_00->data,pos,0);
  if (uVar2 == 0) {
    bVar10 = true;
    bVar9 = false;
    local_8c = 0;
  }
  else {
    uVar3 = QFragmentMapData<QTextBlockData>::position(&this_00->data,uVar2,0);
    bVar9 = pos - uVar3 !=
            (this_00->data).field_0.fragments[uVar2].super_QFragment<3>.size_array[0] - 1;
    uVar3 = QFragmentMapData<QTextBlockData>::position(&this_00->data,uVar2,0);
    bVar10 = uVar3 == pos;
    local_8c = *(int *)((long)(this_00->data).field_0.head + (ulong)uVar2 * 0x48 + 0x44) * 2 >> 1;
  }
  iVar4 = insert_block(this,pos,uVar5,charFormat,blockFormat,op,5);
  uVar2 = QFragmentMapData<QTextBlockData>::findNode(&this_00->data,pos,0);
  pHVar1 = (this->blocks).data.field_0.head;
  local_68.command = 4;
  local_68._2_1_ = this->editBlock != 0;
  local_68.operation = (quint8)op;
  local_68.field_8._4_4_ = 0xaaaaaaaa;
  local_68.field_8.blockFormat = blockFormat;
  lVar8 = (ulong)uVar2 * 0x48;
  local_68._28_4_ = 0xaaaaaaaa;
  local_68.revision = *(int *)((long)pHVar1 + lVar8 + 0x44) * 2 >> 1;
  local_68.format = charFormat;
  local_68.strPos = uVar5;
  local_68.pos = pos;
  appendUndoItem(this,&local_68);
  uVar7 = local_8c;
  if (bVar9) {
    uVar7 = this->revision;
  }
  if (bVar10) {
    uVar7 = this->revision;
  }
  *(uint *)((long)pHVar1 + lVar8 + 0x44) =
       *(uint *)((long)pHVar1 + lVar8 + 0x44) & 0x80000000 | uVar7 & 0x7fffffff;
  uVar5 = QFragmentMapData<QTextBlockData>::next(&this_00->data,uVar2);
  if (uVar5 != 0) {
    pHVar1 = (this->blocks).data.field_0.head;
    if (!bVar10) {
      local_8c = this->revision;
    }
    *(uint *)((long)pHVar1 + (ulong)uVar5 * 0x48 + 0x44) =
         *(uint *)((long)pHVar1 + (ulong)uVar5 * 0x48 + 0x44) & 0x80000000 | local_8c & 0x7fffffff;
  }
  QTextFormatCollection::charFormat
            ((QTextFormatCollection *)&stack0xffffffffffffffb8,(int)this + 0xe8);
  iVar6 = QTextFormat::objectIndex((QTextFormat *)&stack0xffffffffffffffb8);
  QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffffb8);
  if (iVar6 == -1) {
    this->field_0x294 = this->field_0x294 | 1;
  }
  endEditBlock(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

int QTextDocumentPrivate::insertBlock(QChar blockSeparator,
                                  int pos, int blockFormat, int charFormat, QTextUndoCommand::Operation op)
{
    Q_ASSERT(formats.format(blockFormat).isBlockFormat());
    Q_ASSERT(formats.format(charFormat).isCharFormat());
    Q_ASSERT(pos >= 0 && (pos < fragments.length() || (pos == 0 && fragments.length() == 0)));
    Q_ASSERT(isValidBlockSeparator(blockSeparator));

    beginEditBlock();

    int strPos = text.size();
    text.append(blockSeparator);

    int ob = blocks.findNode(pos);
    bool atBlockEnd = true;
    bool atBlockStart = true;
    int oldRevision = 0;
    if (ob) {
        atBlockEnd = (pos - blocks.position(ob) == blocks.size(ob)-1);
        atBlockStart = ((int)blocks.position(ob) == pos);
        oldRevision = blocks.fragment(ob)->revision;
    }

    const int fragment = insert_block(pos, strPos, charFormat, blockFormat, op, QTextUndoCommand::BlockRemoved);

    Q_ASSERT(blocks.length() == fragments.length());

    int b = blocks.findNode(pos);
    QTextBlockData *B = blocks.fragment(b);

    QT_INIT_TEXTUNDOCOMMAND(c, QTextUndoCommand::BlockInserted, (editBlock != 0),
                            op, charFormat, strPos, pos, blockFormat,
                            B->revision);

    appendUndoItem(c);
    Q_ASSERT(undoState == undoStack.size());

    // update revision numbers of the modified blocks.
    B->revision = (atBlockEnd && !atBlockStart)? oldRevision : revision;
    b = blocks.next(b);
    if (b) {
        B = blocks.fragment(b);
        B->revision = atBlockStart ? oldRevision : revision;
    }

    if (formats.charFormat(charFormat).objectIndex() == -1)
        needsEnsureMaximumBlockCount = true;

    endEditBlock();
    return fragment;
}